

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_test.cpp
# Opt level: O3

counter * counter::instance(string *name)

{
  pointer __s2;
  size_t __n;
  int iVar1;
  size_type *psVar2;
  long lVar3;
  long lVar4;
  
  if (instance(std::__cxx11::string_const&)::all == '\0') {
    instance();
  }
  lVar4 = (long)instance::curr;
  if (0 < lVar4) {
    __s2 = (name->_M_dataplus)._M_p;
    __n = name->_M_string_length;
    psVar2 = &instance::all[0].name._M_string_length;
    lVar3 = 0;
    do {
      if (*psVar2 == __n) {
        if (__n == 0) goto LAB_0010bca1;
        iVar1 = bcmp((((string *)(psVar2 + -1))->_M_dataplus)._M_p,__s2,__n);
        if (iVar1 == 0) goto LAB_0010bca1;
      }
      lVar3 = lVar3 + 1;
      psVar2 = psVar2 + 0xb;
    } while (lVar4 != lVar3);
  }
  std::__cxx11::string::_M_assign((string *)(instance::all + lVar4));
  lVar3 = (long)instance::curr;
  instance::curr = instance::curr + 1;
LAB_0010bca1:
  return instance::all + lVar3;
}

Assistant:

static counter *instance(std::string const &name)
	{
		static const int max = 20;
		static int curr;
		static counter all[max];
		for(int i=0;i<curr;i++)
			if(all[i].name==name)
				return all + i;
		assert(curr < max);
		all[curr].name = name;
		return all + curr++;
	}